

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::IsGB(MI<136UL,_GF2::MOGrevlex<136UL>_> *this)

{
  _List_node_base **pp_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *pMVar5;
  const_reverse_iterator iter;
  _List_node_base *p_Var6;
  size_t i;
  ulong i_00;
  _List_node_base **pp_Var7;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  long local_58;
  _List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> local_50;
  
  local_50._M_impl._M_node._M_size = 0;
  local_58 = 0;
  p_Var6 = (_List_node_base *)this;
  local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_50;
  while (p_Var2 = (this->
                  super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  ).
                  super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next, p_Var6 != p_Var2) {
    pp_Var1 = &p_Var6->_M_prev;
    for (i_00 = 0; pp_Var7 = pp_Var1, i_00 != 0x88; i_00 = i_00 + 1) {
      if (((ulong)(&(*pp_Var1)[1]._M_next[1]._M_next)[i_00 >> 6] >> (i_00 & 0x3f) & 1) != 0) {
        pMVar5 = MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                           ((MP<136UL,_GF2::MOGrevlex<136UL>_> *)&local_50,i_00,
                            (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(*pp_Var1 + 1));
        Reduce(this,pMVar5);
        if (local_50._M_impl._M_node._M_size != 0) goto LAB_00130a8d;
      }
    }
    while (p_Var3 = *pp_Var7,
          p_Var3 != (this->
                    super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                    ).
                    super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next) {
      pp_Var7 = &p_Var3->_M_prev;
      bVar4 = MM<136UL>::IsRelPrime
                        ((MM<136UL> *)((*pp_Var1)[1]._M_next + 1),
                         (MM<136UL> *)(p_Var3->_M_prev[1]._M_next + 1));
      if (!bVar4) {
        pMVar5 = MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                           ((MP<136UL,_GF2::MOGrevlex<136UL>_> *)&local_50,
                            (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(*pp_Var1 + 1),
                            (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(*pp_Var7 + 1));
        Reduce(this,pMVar5);
        if (local_50._M_impl._M_node._M_size != 0) goto LAB_00130a8d;
      }
    }
    local_58 = local_58 + 1;
    Env::Trace("IsGB: %zu polys",local_58);
    p_Var6 = *pp_Var1;
  }
LAB_00130a8d:
  std::__cxx11::_List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::_M_clear(&local_50);
  return p_Var6 == p_Var2;
}

Assistant:

bool IsGB() const
	{
		MP<_n, _O> poly(_order);
		// цикл по многочленам
		size_t trace = 0;
        for (const_reverse_iterator iter = rbegin(); iter != rend(); ++iter)
		{
			// цикл по парам (многочлен, уравнение поля)
			for (size_t i = 0; i < _n; i++)
				if (iter->LM().Test(i))
				{
					Reduce(poly.SPoly(i, *iter));
					if (poly != 0)
						return false;
				}
			// цикл по парам (многочлен, многочлен1)
			const_reverse_iterator iter1 = iter;
			for (++iter1; iter1 != rend(); ++iter1)
				if (!iter->LM().IsRelPrime(iter1->LM()))
				{
					Reduce(poly.SPoly(*iter, *iter1));
					if (poly != 0) 
						return false;
				}
			// трассировка
			Env::Trace("IsGB: %zu polys", ++trace);
		}
		return true;
	}